

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

TemporaryFileHandle * __thiscall
duckdb::TemporaryFileMap::CreateFile(TemporaryFileMap *this,TemporaryFileIdentifier *identifier)

{
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var1;
  type pTVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>,_false,_false>,_bool>
  pVar3;
  unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>_>
  uStack_38;
  unsigned_long local_30;
  idx_t local_28;
  
  p_Var1 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)GetMapForSize(this,identifier->size);
  local_28 = optional_idx::GetIndex(&identifier->file_index);
  local_30 = *(unsigned_long *)(p_Var1 + 0x18);
  make_uniq<duckdb::TemporaryFileHandle,duckdb::TemporaryFileManager&,duckdb::TemporaryFileIdentifier_const&,unsigned_long>
            ((duckdb *)&uStack_38,this->manager,identifier,&local_30);
  pVar3 = ::std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<unsigned_long,duckdb::unique_ptr<duckdb::TemporaryFileHandle,std::default_delete<duckdb::TemporaryFileHandle>,true>>
                    (p_Var1,&local_28,&uStack_38);
  ::std::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>_>
  ::~unique_ptr(&uStack_38);
  pTVar2 = unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
           ::operator*((unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
                        *)((long)pVar3.first.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>,_false>
                                 ._M_cur.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>,_false>
                          + 0x10));
  return pTVar2;
}

Assistant:

TemporaryFileHandle &TemporaryFileMap::CreateFile(const TemporaryFileIdentifier &identifier) {
	D_ASSERT(identifier.IsValid());
	D_ASSERT(!GetFile(identifier));
	auto &map = GetMapForSize(identifier.size);
	const auto res =
	    map.emplace(identifier.file_index.GetIndex(), make_uniq<TemporaryFileHandle>(manager, identifier, map.size()));
	D_ASSERT(res.second);
	return *res.first->second;
}